

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O0

void __thiscall
icu_63::numparse::impl::AffixMatcher::postProcess(AffixMatcher *this,ParsedNumber *result)

{
  bool bVar1;
  UBool UVar2;
  UnicodeString local_98;
  UnicodeString local_58;
  ParsedNumber *local_18;
  ParsedNumber *result_local;
  AffixMatcher *this_local;
  
  local_18 = result;
  result_local = (ParsedNumber *)this;
  bVar1 = anon_unknown.dwarf_19d251::matched(this->fPrefix,&result->prefix);
  if ((bVar1) &&
     (bVar1 = anon_unknown.dwarf_19d251::matched(this->fSuffix,&local_18->suffix), bVar1)) {
    UVar2 = UnicodeString::isBogus(&local_18->prefix);
    if (UVar2 != '\0') {
      UnicodeString::UnicodeString(&local_58);
      UnicodeString::operator=(&local_18->prefix,&local_58);
      UnicodeString::~UnicodeString(&local_58);
    }
    UVar2 = UnicodeString::isBogus(&local_18->suffix);
    if (UVar2 != '\0') {
      UnicodeString::UnicodeString(&local_98);
      UnicodeString::operator=(&local_18->suffix,&local_98);
      UnicodeString::~UnicodeString(&local_98);
    }
    local_18->flags = this->fFlags | local_18->flags;
    if (this->fPrefix != (AffixPatternMatcher *)0x0) {
      (*(this->fPrefix->super_ArraySeriesMatcher).super_SeriesMatcher.super_CompositionMatcher.
        super_NumberParseMatcher._vptr_NumberParseMatcher[5])(this->fPrefix,local_18);
    }
    if (this->fSuffix != (AffixPatternMatcher *)0x0) {
      (*(this->fSuffix->super_ArraySeriesMatcher).super_SeriesMatcher.super_CompositionMatcher.
        super_NumberParseMatcher._vptr_NumberParseMatcher[5])(this->fSuffix,local_18);
    }
  }
  return;
}

Assistant:

void AffixMatcher::postProcess(ParsedNumber& result) const {
    // Check to see if our affix is the one that was matched. If so, set the flags in the result.
    if (matched(fPrefix, result.prefix) && matched(fSuffix, result.suffix)) {
        // Fill in the result prefix and suffix with non-null values (empty string).
        // Used by strict mode to determine whether an entire affix pair was matched.
        if (result.prefix.isBogus()) {
            result.prefix = UnicodeString();
        }
        if (result.suffix.isBogus()) {
            result.suffix = UnicodeString();
        }
        result.flags |= fFlags;
        if (fPrefix != nullptr) {
            fPrefix->postProcess(result);
        }
        if (fSuffix != nullptr) {
            fSuffix->postProcess(result);
        }
    }
}